

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

void __thiscall
leveldb::MemTableConstructor::MemTableConstructor(MemTableConstructor *this,Comparator *cmp)

{
  MemTable *this_00;
  Comparator *cmp_local;
  MemTableConstructor *this_local;
  
  Constructor::Constructor(&this->super_Constructor,cmp);
  (this->super_Constructor)._vptr_Constructor = (_func_int **)&PTR__MemTableConstructor_001f3dd0;
  InternalKeyComparator::InternalKeyComparator(&this->internal_comparator_,cmp);
  this_00 = (MemTable *)operator_new(0x70);
  MemTable::MemTable(this_00,&this->internal_comparator_);
  this->memtable_ = this_00;
  MemTable::Ref(this->memtable_);
  return;
}

Assistant:

explicit MemTableConstructor(const Comparator* cmp)
      : Constructor(cmp), internal_comparator_(cmp) {
    memtable_ = new MemTable(internal_comparator_);
    memtable_->Ref();
  }